

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

long days_untill_year(uint32_t year)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (year == 0x7b2) {
    return 0;
  }
  lVar1 = 0;
  uVar3 = 0x7b2;
  do {
    lVar4 = 0x16d;
    iVar2 = (int)uVar3;
    if ((uVar3 & 3) == 0) {
      lVar4 = (ulong)((int)(uVar3 / 400) * -400 + 0x7b2 + iVar2 == 0x7b2 ||
                     (int)(uVar3 / 100) * -100 + 0x7b2 + iVar2 != 0x7b2) + 0x16d;
    }
    lVar1 = lVar1 + lVar4;
    uVar3 = (ulong)(iVar2 + 1U);
  } while (year != iVar2 + 1U);
  return lVar1;
}

Assistant:

long days_untill_year(uint32_t year)
{
	long days{ 0 };
	int y{ 1970 };
	while (y != year)
	{
		auto days_in_the_year = leapyear(y) ? 366 : 365;
		days += days_in_the_year;
		++y;
	}
	return days;
}